

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

void imdct_step3_iter0_loop(int n,float *e,int i_off,int k_off,float *A)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float k01_21;
  float k00_20;
  int i;
  float *ee2;
  float *ee0;
  float *A_local;
  int k_off_local;
  int i_off_local;
  float *e_local;
  int n_local;
  
  ee0 = e + i_off;
  ee2 = ee0 + k_off;
  A_local = A;
  for (i = n >> 2; 0 < i; i = i + -1) {
    fVar1 = *ee0;
    fVar2 = *ee2;
    fVar3 = ee0[-1];
    fVar4 = ee2[-1];
    *ee0 = *ee2 + *ee0;
    ee0[-1] = ee2[-1] + ee0[-1];
    *ee2 = (fVar1 - fVar2) * *A_local + -((fVar3 - fVar4) * A_local[1]);
    ee2[-1] = (fVar3 - fVar4) * *A_local + (fVar1 - fVar2) * A_local[1];
    fVar1 = ee0[-2];
    fVar2 = ee2[-2];
    fVar3 = ee0[-3];
    fVar4 = ee2[-3];
    ee0[-2] = ee2[-2] + ee0[-2];
    ee0[-3] = ee2[-3] + ee0[-3];
    ee2[-2] = (fVar1 - fVar2) * A_local[8] + -((fVar3 - fVar4) * A_local[9]);
    ee2[-3] = (fVar3 - fVar4) * A_local[8] + (fVar1 - fVar2) * A_local[9];
    fVar1 = ee0[-4];
    fVar2 = ee2[-4];
    fVar3 = ee0[-5];
    fVar4 = ee2[-5];
    ee0[-4] = ee2[-4] + ee0[-4];
    ee0[-5] = ee2[-5] + ee0[-5];
    ee2[-4] = (fVar1 - fVar2) * A_local[0x10] + -((fVar3 - fVar4) * A_local[0x11]);
    ee2[-5] = (fVar3 - fVar4) * A_local[0x10] + (fVar1 - fVar2) * A_local[0x11];
    fVar1 = ee0[-6];
    fVar2 = ee2[-6];
    fVar3 = ee0[-7];
    fVar4 = ee2[-7];
    ee0[-6] = ee2[-6] + ee0[-6];
    ee0[-7] = ee2[-7] + ee0[-7];
    ee2[-6] = (fVar1 - fVar2) * A_local[0x18] + -((fVar3 - fVar4) * A_local[0x19]);
    ee2[-7] = (fVar3 - fVar4) * A_local[0x18] + (fVar1 - fVar2) * A_local[0x19];
    A_local = A_local + 0x20;
    ee0 = ee0 + -8;
    ee2 = ee2 + -8;
  }
  return;
}

Assistant:

static void imdct_step3_iter0_loop(int n, float *e, int i_off, int k_off, float *A)
{
   float *ee0 = e + i_off;
   float *ee2 = ee0 + k_off;
   int i;

   assert((n & 3) == 0);
   for (i=(n>>2); i > 0; --i) {
      float k00_20, k01_21;
      k00_20  = ee0[ 0] - ee2[ 0];
      k01_21  = ee0[-1] - ee2[-1];
      ee0[ 0] += ee2[ 0];//ee0[ 0] = ee0[ 0] + ee2[ 0];
      ee0[-1] += ee2[-1];//ee0[-1] = ee0[-1] + ee2[-1];
      ee2[ 0] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-1] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;

      k00_20  = ee0[-2] - ee2[-2];
      k01_21  = ee0[-3] - ee2[-3];
      ee0[-2] += ee2[-2];//ee0[-2] = ee0[-2] + ee2[-2];
      ee0[-3] += ee2[-3];//ee0[-3] = ee0[-3] + ee2[-3];
      ee2[-2] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-3] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;

      k00_20  = ee0[-4] - ee2[-4];
      k01_21  = ee0[-5] - ee2[-5];
      ee0[-4] += ee2[-4];//ee0[-4] = ee0[-4] + ee2[-4];
      ee0[-5] += ee2[-5];//ee0[-5] = ee0[-5] + ee2[-5];
      ee2[-4] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-5] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;

      k00_20  = ee0[-6] - ee2[-6];
      k01_21  = ee0[-7] - ee2[-7];
      ee0[-6] += ee2[-6];//ee0[-6] = ee0[-6] + ee2[-6];
      ee0[-7] += ee2[-7];//ee0[-7] = ee0[-7] + ee2[-7];
      ee2[-6] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-7] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;
      ee0 -= 8;
      ee2 -= 8;
   }
}